

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict type_qual_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  uint uVar2;
  node_t_conflict n;
  node_t_conflict op;
  int no_err_p_00;
  node_t_conflict pnVar3;
  
  ppVar1 = c2m_ctx->parse_ctx;
  no_err_p_00 = 0x54;
  n = new_node(c2m_ctx,N_LIST);
  op = type_qual(c2m_ctx,no_err_p_00);
  if (op != &err_struct) {
    do {
      pnVar3 = n;
      op_append(c2m_ctx,n,op);
      uVar2 = *(ushort *)ppVar1->curr_token - 0x114;
      if (0x27 < uVar2) {
        return n;
      }
      if ((0x8004000401U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        return n;
      }
      op = type_qual(c2m_ctx,(int)pnVar3);
    } while (op != &err_struct);
  }
  return &err_struct;
}

Assistant:

D (type_qual_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r;

  list = new_node (c2m_ctx, N_LIST);
  for (;;) {
    P (type_qual);
    op_append (c2m_ctx, list, r);
    if (!C (T_CONST) && !C (T_RESTRICT) && !C (T_VOLATILE) && !C (T_ATOMIC)) break;
  }
  return list;
}